

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall cashew::JSPrinter::printUnaryPrefix(JSPrinter *this,Ref node)

{
  bool bVar1;
  int iVar2;
  Ref *pRVar3;
  char *pcVar4;
  Value *pVVar5;
  char *pcVar6;
  char *local_40;
  char *end;
  char *e;
  char *curr;
  int last;
  JSPrinter *this_local;
  Ref node_local;
  
  this_local = (JSPrinter *)node.inst;
  if ((this->finalize & 1U) != 0) {
    pRVar3 = Ref::operator[]((Ref *)&this_local,1);
    bVar1 = Ref::operator==(pRVar3,(IString *)&PLUS);
    if (bVar1) {
      pRVar3 = Ref::operator[]((Ref *)&this_local,2);
      pVVar5 = Ref::operator->(pRVar3);
      bVar1 = cashew::Value::isNumber(pVVar5);
      if (bVar1) {
LAB_0272f79c:
        iVar2 = (int)this->used;
        pRVar3 = Ref::operator[]((Ref *)&this_local,2);
        print(this,pRVar3->inst);
        ensure(this,1);
        pcVar6 = this->buffer + iVar2;
        this->buffer[this->used] = '\0';
        pcVar4 = strstr(pcVar6,"Infinity");
        if (pcVar4 != (char *)0x0) {
          return;
        }
        pcVar4 = strstr(pcVar6,"NaN");
        if (pcVar4 != (char *)0x0) {
          return;
        }
        pcVar4 = strchr(pcVar6,0x2e);
        if (pcVar4 != (char *)0x0) {
          return;
        }
        pcVar6 = strchr(pcVar6,0x65);
        if (pcVar6 == (char *)0x0) {
          emit(this,".0");
          return;
        }
        ensure(this,3);
        for (local_40 = strchr(this->buffer + iVar2,0); pcVar6 <= local_40; local_40 = local_40 + -1
            ) {
          local_40[2] = *local_40;
        }
        *pcVar6 = '.';
        pcVar6[1] = '0';
        this->used = this->used + 2;
        return;
      }
      pRVar3 = Ref::operator[]((Ref *)&this_local,2);
      pVVar5 = Ref::operator->(pRVar3);
      bVar1 = cashew::Value::isArray(pVVar5);
      if (bVar1) {
        pRVar3 = Ref::operator[]((Ref *)&this_local,2);
        pRVar3 = Ref::operator[](pRVar3,0);
        bVar1 = Ref::operator==(pRVar3,(IString *)UNARY_PREFIX);
        if (bVar1) {
          pRVar3 = Ref::operator[]((Ref *)&this_local,2);
          pRVar3 = Ref::operator[](pRVar3,1);
          bVar1 = Ref::operator==(pRVar3,(IString *)&MINUS);
          if (bVar1) {
            pRVar3 = Ref::operator[]((Ref *)&this_local,2);
            pRVar3 = Ref::operator[](pRVar3,2);
            pVVar5 = Ref::operator->(pRVar3);
            bVar1 = cashew::Value::isNumber(pVVar5);
            if (bVar1) goto LAB_0272f79c;
          }
        }
      }
    }
  }
  if (this->buffer[this->used - 1] == '-') {
    pRVar3 = Ref::operator[]((Ref *)&this_local,1);
    bVar1 = Ref::operator==(pRVar3,(IString *)&MINUS);
    if (!bVar1) goto LAB_0272f926;
  }
  else {
LAB_0272f926:
    if (this->buffer[this->used - 1] != '+') goto LAB_0272f970;
    pRVar3 = Ref::operator[]((Ref *)&this_local,1);
    bVar1 = Ref::operator==(pRVar3,(IString *)&PLUS);
    if (!bVar1) goto LAB_0272f970;
  }
  emit(this,' ');
LAB_0272f970:
  pRVar3 = Ref::operator[]((Ref *)&this_local,1);
  pVVar5 = Ref::operator->(pRVar3);
  pcVar6 = cashew::Value::getCString(pVVar5);
  emit(this,pcVar6);
  pRVar3 = Ref::operator[]((Ref *)&this_local,2);
  printChild(this,pRVar3->inst,(Ref)this_local,1);
  return;
}

Assistant:

void printUnaryPrefix(Ref node) {
    if (finalize && node[1] == PLUS &&
        (node[2]->isNumber() ||
         (node[2]->isArray() && node[2][0] == UNARY_PREFIX &&
          node[2][1] == MINUS && node[2][2]->isNumber()))) {
      // emit a finalized number
      int last = used;
      print(node[2]);
      ensure(1);                  // we temporarily append a 0
      char* curr = buffer + last; // ensure might invalidate
      buffer[used] = 0;
      if (strstr(curr, "Infinity")) {
        return;
      }
      if (strstr(curr, "NaN")) {
        return;
      }
      if (strchr(curr, '.')) {
        return; // already a decimal point, all good
      }
      char* e = strchr(curr, 'e');
      if (!e) {
        emit(".0");
        return;
      }
      ensure(3);
      curr = buffer + last; // ensure might invalidate
      char* end = strchr(curr, 0);
      while (end >= e) {
        end[2] = end[0];
        end--;
      }
      e[0] = '.';
      e[1] = '0';
      used += 2;
      return;
    }
    if ((buffer[used - 1] == '-' && node[1] == MINUS) ||
        (buffer[used - 1] == '+' && node[1] == PLUS)) {
      emit(' '); // cannot join - and - to --, looks like the -- operator
    }
    emit(node[1]->getCString());
    printChild(node[2], node, 1);
  }